

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ConfigDeclareVtab(Fts5Config *pConfig)

{
  bool bVar1;
  char *pcVar2;
  char *zSep;
  char *zSql;
  int rc;
  int i;
  Fts5Config *pConfig_local;
  
  zSql._0_4_ = 0;
  _rc = pConfig;
  zSep = sqlite3Fts5Mprintf((int *)&zSql,"CREATE TABLE x(");
  zSql._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (zSep != (char *)0x0) {
      bVar1 = zSql._4_4_ < _rc->nCol;
    }
    if (!bVar1) break;
    pcVar2 = ", ";
    if (zSql._4_4_ == 0) {
      pcVar2 = "";
    }
    zSep = sqlite3Fts5Mprintf((int *)&zSql,"%z%s%Q",zSep,pcVar2,_rc->azCol[zSql._4_4_]);
    zSql._4_4_ = zSql._4_4_ + 1;
  }
  pcVar2 = sqlite3Fts5Mprintf((int *)&zSql,"%z, %Q HIDDEN, %s HIDDEN)",zSep,_rc->zName,"rank");
  if (pcVar2 != (char *)0x0) {
    zSql._0_4_ = sqlite3_declare_vtab(_rc->db,pcVar2);
    sqlite3_free(pcVar2);
  }
  return (int)zSql;
}

Assistant:

static int sqlite3Fts5ConfigDeclareVtab(Fts5Config *pConfig){
  int i;
  int rc = SQLITE_OK;
  char *zSql;

  zSql = sqlite3Fts5Mprintf(&rc, "CREATE TABLE x(");
  for(i=0; zSql && i<pConfig->nCol; i++){
    const char *zSep = (i==0?"":", ");
    zSql = sqlite3Fts5Mprintf(&rc, "%z%s%Q", zSql, zSep, pConfig->azCol[i]);
  }
  zSql = sqlite3Fts5Mprintf(&rc, "%z, %Q HIDDEN, %s HIDDEN)", 
      zSql, pConfig->zName, FTS5_RANK_NAME
  );

  assert( zSql || rc==SQLITE_NOMEM );
  if( zSql ){
    rc = sqlite3_declare_vtab(pConfig->db, zSql);
    sqlite3_free(zSql);
  }
  
  return rc;
}